

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O1

int pzshape::TPZShapeDisc::NShapeF(int degree,int dimension,MShapeType type)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar8 [16];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  
  switch(dimension) {
  case 0:
    iVar1 = 1;
    break;
  case 1:
    iVar1 = degree + 1;
    break;
  case 2:
    iVar1 = degree + 1;
    if ((type & ~ETensorialFull) == ETensorial) {
      iVar1 = iVar1 * iVar1;
    }
    else {
      iVar1 = (iVar1 * (degree + 2)) / 2;
    }
    break;
  case 3:
    if ((type & ~ETensorialFull) == ETensorial) {
      iVar1 = degree + 1;
      iVar1 = iVar1 * iVar1 * iVar1;
    }
    else if (degree < 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = (degree & 0x7ffffffcU) + 4;
      uVar2 = 0;
      uVar3 = 1;
      uVar4 = 2;
      uVar5 = 3;
      uVar7 = 0;
      uVar10 = 0;
      uVar12 = 0;
      uVar14 = 0;
      do {
        uVar13 = uVar14;
        uVar11 = uVar12;
        uVar9 = uVar10;
        uVar6 = uVar7;
        uVar18 = uVar5;
        uVar17 = uVar4;
        uVar16 = uVar3;
        uVar15 = uVar2;
        auVar8._0_4_ = uVar15 + 1;
        auVar8._4_4_ = uVar16 + 1;
        auVar8._8_4_ = uVar17 + 1;
        auVar8._12_4_ = uVar18 + 1;
        auVar19._4_4_ = uVar16 + 2;
        auVar19._12_4_ = uVar18 + 2;
        auVar19._0_4_ = auVar19._4_4_;
        auVar19._8_4_ = auVar19._12_4_;
        uVar7 = (auVar8._0_4_ * (uVar15 + 2) >> 1) + uVar6;
        uVar10 = ((uint)(auVar19._4_4_ * auVar8._4_4_) >> 1) + uVar9;
        uVar12 = ((uint)((auVar8._8_8_ & 0xffffffff) * (ulong)(uVar17 + 2)) >> 1) + uVar11;
        uVar14 = ((uint)((auVar19._8_8_ & 0xffffffff) * (ulong)auVar8._12_4_) >> 1) + uVar13;
        iVar1 = iVar1 + -4;
        uVar2 = uVar15 + 4;
        uVar3 = uVar16 + 4;
        uVar4 = uVar17 + 4;
        uVar5 = uVar18 + 4;
      } while (iVar1 != 0);
      uVar2 = -(uint)((int)(degree ^ 0x80000000U) < (int)(uVar15 ^ 0x80000000));
      uVar3 = -(uint)((int)(degree ^ 0x80000000U) < (int)(uVar16 ^ 0x80000000));
      uVar4 = -(uint)((int)(degree ^ 0x80000000U) < (int)(uVar17 ^ 0x80000000));
      uVar5 = -(uint)((int)(degree ^ 0x80000000U) < (int)(uVar18 ^ 0x80000000));
      iVar1 = (~uVar5 & uVar14 | uVar13 & uVar5) + (~uVar3 & uVar10 | uVar9 & uVar3) +
              (~uVar4 & uVar12 | uVar11 & uVar4) + (~uVar2 & uVar7 | uVar6 & uVar2);
    }
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZShapeDisc::NShapeF case does not exists\n",0x2b);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int  TPZShapeDisc::NShapeF(int degree, int dimension, MShapeType type) {
  int sum =0,i;
  switch(dimension) {
  case 0:
      return 1;
  case 1:
    return degree+1;
//    break;
  case 2:
    if(type == ETensorial || type == ETensorialFull) return (degree+1)*(degree+1);
    else return (degree+1)*(degree+2)/2;
//    break;
  case 3:
    if(type == ETensorial || type == ETensorialFull) return (degree+1)*(degree+1)*(degree+1);
    for(i=0;i<(degree+1);i++) sum += (i+1)*(i+2)/2;
    return sum;
 //   break;
  default:
      PZError << "TPZShapeDisc::NShapeF case does not exists\n";
      return -1;
  }
//  return -1;
}